

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFMT.cpp
# Opt level: O0

void __thiscall FRandom::PeriodCertification(FRandom *this)

{
  int iVar1;
  uint local_20;
  int local_1c;
  DWORD work;
  int j;
  int i;
  int inner;
  FRandom *this_local;
  
  j = 0;
  for (work = 0; (int)work < 4; work = work + 1) {
    iVar1 = idxof(work);
    j = *(uint *)((long)&this->sfmt + (long)iVar1 * 4) & parity[(int)work] ^ j;
  }
  for (work = 0x10; work != 0; work = (int)work >> 1) {
    j = j >> (sbyte)work ^ j;
  }
  if ((j & 1U) != 1) {
    for (work = 0; (int)work < 4; work = work + 1) {
      local_20 = 1;
      for (local_1c = 0; local_1c < 0x20; local_1c = local_1c + 1) {
        if ((local_20 & parity[(int)work]) != 0) {
          iVar1 = idxof(work);
          *(uint *)((long)&this->sfmt + (long)iVar1 * 4) =
               local_20 ^ *(uint *)((long)&this->sfmt + (long)iVar1 * 4);
          return;
        }
        local_20 = local_20 << 1;
      }
    }
  }
  return;
}

Assistant:

void FRandom::PeriodCertification()
{
	int inner = 0;
	int i, j;
	DWORD work;

	for (i = 0; i < 4; i++)
		inner ^= sfmt.u[idxof(i)] & parity[i];
	for (i = 16; i > 0; i >>= 1)
		inner ^= inner >> i;
	inner &= 1;
	/* check OK */
	if (inner == 1) {
		return;
	}
	/* check NG, and modification */
	for (i = 0; i < 4; i++) {
		work = 1;
		for (j = 0; j < 32; j++) {
			if ((work & parity[i]) != 0) {
				sfmt.u[idxof(i)] ^= work;
				return;
			}
			work = work << 1;
		}
	}
}